

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

Abc_Obj_t * Abc_NtkCloneObj(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pFanin_00;
  int local_24;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pClone;
  Abc_Obj_t *pObj_local;
  
  pObj_00 = Abc_NtkCreateObj(pObj->pNtk,
                             *(Abc_ObjType_t *)&pObj->field_0x14 & (ABC_OBJ_LATCH|ABC_OBJ_NODE));
  for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
    pFanin_00 = Abc_ObjFanin(pObj,local_24);
    Abc_ObjAddFanin(pObj_00,pFanin_00);
  }
  return pObj_00;
}

Assistant:

Abc_Obj_t * Abc_NtkCloneObj( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pClone, * pFanin;
    int i;
    pClone = Abc_NtkCreateObj( pObj->pNtk, (Abc_ObjType_t)pObj->Type );   
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_ObjAddFanin( pClone, pFanin );
    return pClone;
}